

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::RelocateCallDirectToHelperPath
          (Lowerer *this,Instr *argoutInlineSpecialized,LabelInstr *labelHelper)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  SymOpnd *pSVar4;
  StackSym *pSVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  Instr *startCall;
  StackSym *sym;
  Instr *argInstr;
  StackSym *sym_1;
  SymOpnd *src2;
  Opnd *linkOpnd;
  LabelInstr *labelHelper_local;
  Instr *argoutInlineSpecialized_local;
  Lowerer *this_local;
  
  src2 = (SymOpnd *)IR::Instr::GetSrc2(argoutInlineSpecialized);
  IR::Instr::Unlink(argoutInlineSpecialized);
  IR::Instr::InsertAfter(&labelHelper->super_Instr,argoutInlineSpecialized);
  while( true ) {
    bVar3 = IR::Opnd::IsSymOpnd(&src2->super_Opnd);
    if (!bVar3) break;
    pSVar4 = IR::Opnd::AsSymOpnd(&src2->super_Opnd);
    pSVar5 = Sym::AsStackSym(pSVar4->m_sym);
    if ((*(uint *)&pSVar5->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5237,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pIVar1 = (pSVar5->field_5).m_instrDef;
    if (pIVar1->m_opcode != ArgOut_A) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5239,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                         "argInstr->m_opcode == Js::OpCode::ArgOut_A");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    IR::Instr::Unlink(pIVar1);
    IR::Instr::InsertAfter(&labelHelper->super_Instr,pIVar1);
    src2 = (SymOpnd *)IR::Instr::GetSrc2(pIVar1);
  }
  bVar3 = IR::Opnd::IsRegOpnd(&src2->super_Opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5242,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(&src2->super_Opnd);
  pSVar5 = pRVar7->m_sym;
  if ((*(uint *)&pSVar5->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5244,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pIVar1 = (pSVar5->field_5).m_instrDef;
  if (pIVar1->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5246,"(startCall->m_opcode == Js::OpCode::StartCall)",
                       "startCall->m_opcode == Js::OpCode::StartCall");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  IR::Instr::Unlink(pIVar1);
  IR::Instr::InsertAfter(&labelHelper->super_Instr,pIVar1);
  return;
}

Assistant:

void
Lowerer::RelocateCallDirectToHelperPath(IR::Instr* argoutInlineSpecialized, IR::LabelInstr* labelHelper)
{
    IR::Opnd *linkOpnd = argoutInlineSpecialized->GetSrc2(); //ArgOut_A_InlineSpecialized src2; link to actual argouts.

    argoutInlineSpecialized->Unlink();
    labelHelper->InsertAfter(argoutInlineSpecialized);

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd *src2 = linkOpnd->AsSymOpnd();
        StackSym *sym = src2->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;
        Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);

        argInstr->Unlink();
        labelHelper->InsertAfter(argInstr);

        linkOpnd = argInstr->GetSrc2();
    }

    //  Move startcall
    Assert(linkOpnd->IsRegOpnd());
    StackSym *sym = linkOpnd->AsRegOpnd()->m_sym;
    Assert(sym->m_isSingleDef);
    IR::Instr *startCall = sym->m_instrDef;
    Assert(startCall->m_opcode == Js::OpCode::StartCall);
    startCall->Unlink();
    labelHelper->InsertAfter(startCall);
}